

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_aggregate_functions.cpp
# Opt level: O2

void RepeatedStringAggCombine
               (duckdb_function_info info,duckdb_aggregate_state *source_p,
               duckdb_aggregate_state *target_p,idx_t count)

{
  duckdb_aggregate_state p_Var1;
  size_t __n;
  long lVar2;
  long lVar3;
  void *__dest;
  idx_t i;
  idx_t iVar4;
  
  for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
    if (*(long *)(source_p[iVar4] + 8) != 0) {
      p_Var1 = target_p[iVar4];
      __n = *(size_t *)(p_Var1 + 8);
      __dest = malloc(*(long *)(source_p[iVar4] + 8) + __n + 1);
      if (__n != 0) {
        memcpy(__dest,*(void **)p_Var1,__n);
      }
      free(*(void **)p_Var1);
      p_Var1 = target_p[iVar4];
      memcpy((void *)(*(long *)(p_Var1 + 8) + (long)__dest),*(void **)source_p[iVar4],
             *(size_t *)(source_p[iVar4] + 8));
      *(void **)p_Var1 = __dest;
      p_Var1 = target_p[iVar4];
      lVar2 = *(long *)(p_Var1 + 8);
      lVar3 = *(long *)(source_p[iVar4] + 8);
      *(long *)(p_Var1 + 8) = lVar2 + lVar3;
      *(undefined1 *)(*(long *)p_Var1 + lVar2 + lVar3) = 0;
    }
  }
  return;
}

Assistant:

void RepeatedStringAggCombine(duckdb_function_info info, duckdb_aggregate_state *source_p,
                              duckdb_aggregate_state *target_p, idx_t count) {
	auto source = reinterpret_cast<RepeatedStringAggState **>(source_p);
	auto target = reinterpret_cast<RepeatedStringAggState **>(target_p);

	for (idx_t i = 0; i < count; i++) {
		if (source[i]->size == 0) {
			continue;
		}
		auto new_data = (char *)malloc(target[i]->size + source[i]->size + 1);
		if (target[i]->size > 0) {
			memcpy((void *)new_data, target[i]->data, target[i]->size);
		}
		if (target[i]->data) {
			free((void *)target[i]->data);
		}
		memcpy((void *)(new_data + target[i]->size), source[i]->data, source[i]->size);
		target[i]->data = new_data;
		target[i]->size += source[i]->size;
		target[i]->data[target[i]->size] = '\0';
	}
}